

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O0

AInventory * __thiscall ABasicArmor::CreateCopy(ABasicArmor *this,AActor *other)

{
  ABasicArmor *pAVar1;
  double local_30;
  ABasicArmor *copy;
  AActor *other_local;
  ABasicArmor *this_local;
  
  pAVar1 = Spawn<ABasicArmor>();
  if ((this->SavePercent != 0.0) || (NAN(this->SavePercent))) {
    local_30 = this->SavePercent;
  }
  else {
    local_30 = 0.33335;
  }
  pAVar1->SavePercent = local_30;
  (pAVar1->super_AArmor).super_AInventory.Amount = (this->super_AArmor).super_AInventory.Amount;
  (pAVar1->super_AArmor).super_AInventory.MaxAmount =
       (this->super_AArmor).super_AInventory.MaxAmount;
  (pAVar1->super_AArmor).super_AInventory.Icon.texnum =
       (this->super_AArmor).super_AInventory.Icon.texnum;
  pAVar1->BonusCount = this->BonusCount;
  FNameNoInit::operator=(&pAVar1->ArmorType,&this->ArmorType);
  pAVar1->ActualSaveAmount = this->ActualSaveAmount;
  (*(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])();
  return (AInventory *)pAVar1;
}

Assistant:

AInventory *ABasicArmor::CreateCopy (AActor *other)
{
	// BasicArmor that is in use is stored in the inventory as BasicArmor.
	// BasicArmor that is in reserve is not.
	ABasicArmor *copy = Spawn<ABasicArmor> ();
	copy->SavePercent = SavePercent != 0 ? SavePercent : 0.33335;	// slightly more than 1/3 to avoid roundoff errors.
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->Icon = Icon;
	copy->BonusCount = BonusCount;
	copy->ArmorType = ArmorType;
	copy->ActualSaveAmount = ActualSaveAmount;
	GoAwayAndDie ();
	return copy;
}